

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CGL::Application::initialize_style(Application *this)

{
  (this->defaultStyle).halfedgeColor.r = 0.3;
  (this->defaultStyle).halfedgeColor.g = 0.3;
  (this->defaultStyle).halfedgeColor.b = 0.3;
  (this->defaultStyle).vertexColor.r = 0.3;
  (this->defaultStyle).vertexColor.g = 0.3;
  (this->defaultStyle).vertexColor.b = 0.3;
  (this->defaultStyle).edgeColor.r = 0.3;
  (this->defaultStyle).edgeColor.g = 0.3;
  (this->hoverStyle).halfedgeColor.b = 0.6;
  (this->hoverStyle).vertexColor.r = 0.6;
  (this->hoverStyle).vertexColor.g = 0.6;
  (this->hoverStyle).vertexColor.b = 0.6;
  (this->hoverStyle).edgeColor.r = 0.6;
  (this->hoverStyle).edgeColor.g = 0.6;
  (this->hoverStyle).edgeColor.b = 0.6;
  (this->hoverStyle).faceColor.r = 0.6;
  (this->selectStyle).vertexColor.g = 1.0;
  (this->selectStyle).vertexColor.b = 1.0;
  (this->selectStyle).edgeColor.r = 1.0;
  (this->selectStyle).edgeColor.g = 1.0;
  (this->selectStyle).edgeColor.b = 1.0;
  (this->selectStyle).faceColor.r = 1.0;
  (this->selectStyle).faceColor.g = 1.0;
  (this->selectStyle).faceColor.b = 1.0;
  *(undefined8 *)&(this->defaultStyle).edgeColor.b = 0x3e99999a3e99999a;
  (this->defaultStyle).faceColor.g = 0.3;
  (this->defaultStyle).faceColor.b = 0.3;
  (this->defaultStyle).strokeWidth = 1.0;
  (this->defaultStyle).vertexRadius = 4.0;
  (this->hoverStyle).halfedgeColor.r = 0.6;
  (this->hoverStyle).halfedgeColor.g = 0.6;
  (this->hoverStyle).faceColor.g = 0.6;
  (this->hoverStyle).faceColor.b = 0.6;
  (this->hoverStyle).strokeWidth = 2.0;
  (this->hoverStyle).vertexRadius = 8.0;
  (this->selectStyle).halfedgeColor.r = 1.0;
  (this->selectStyle).halfedgeColor.g = 1.0;
  *(undefined8 *)&(this->selectStyle).halfedgeColor.b = 0x3f8000003f800000;
  (this->selectStyle).strokeWidth = 2.0;
  (this->selectStyle).vertexRadius = 8.0;
  return;
}

Assistant:

void Application::initialize_style() {
  // Colors.
  defaultStyle.halfedgeColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.halfedgeColor = Color( 0.6, 0.6, 0.6);
   selectStyle.halfedgeColor = Color( 1.0, 1.0, 1.0);

  defaultStyle.faceColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.faceColor = Color( 0.6, 0.6, 0.6);
   selectStyle.faceColor = Color( 1.0, 1.0, 1.0);

  defaultStyle.edgeColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.edgeColor = Color( 0.6, 0.6, 0.6);
   selectStyle.edgeColor = Color( 1.0, 1.0, 1.0);

  defaultStyle.vertexColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.vertexColor = Color( 0.6, 0.6, 0.6);
   selectStyle.vertexColor = Color( 1.0, 1.0, 1.0);

  // Primitive sizes.
  defaultStyle.strokeWidth = 1.0;
    hoverStyle.strokeWidth = 2.0;
   selectStyle.strokeWidth = 2.0;

  defaultStyle.vertexRadius = 4.0;
    hoverStyle.vertexRadius = 8.0;
   selectStyle.vertexRadius = 8.0;
}